

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequences.hpp
# Opt level: O1

iterator_range<burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
* __thiscall
burst::subsequences<std::initializer_list<int>const&>
          (iterator_range<burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
           *__return_storage_ptr__,burst *this,initializer_list<int> *range)

{
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> *End;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> begin;
  int *local_b8;
  int *piStack_b0;
  pointer local_a8;
  pointer ppiStack_a0;
  pointer local_98;
  difference_type dStack_90;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_88;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_58;
  
  End = *(subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
          **)(this + 8);
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
  subsequence_iterator(&local_58,*(int **)this,*(int **)this + (long)End);
  local_b8 = local_58.m_begin;
  piStack_b0 = local_58.m_end;
  local_a8 = local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppiStack_a0 = local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  dStack_90 = local_58.m_subsequence_size;
  local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_begin = local_58.m_begin;
  local_88.m_end = local_58.m_end;
  local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_subsequence_size = 0;
  boost::
  make_iterator_range<burst::subsequence_iterator<int_const*,std::vector<int_const*,std::allocator<int_const*>>>>
            (__return_storage_ptr__,(boost *)&local_b8,&local_88,End);
  if (local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_subsequence.
                    super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.m_subsequence.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_subsequence.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8 != (pointer)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if (local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_subsequence.
                    super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.m_subsequence.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.m_subsequence.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto subsequences (ForwardRange && range)
    {
        auto begin = make_subsequence_iterator(std::forward<ForwardRange>(range));
        auto end = make_subsequence_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }